

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QList<QGraphicsTransform_*> * __thiscall
QGraphicsItem::transformations
          (QList<QGraphicsTransform_*> *__return_storage_ptr__,QGraphicsItem *this)

{
  TransformData *pTVar1;
  Data *pDVar2;
  
  pTVar1 = ((this->d_ptr).d)->transformData;
  if (pTVar1 != (TransformData *)0x0) {
    pDVar2 = (pTVar1->graphicsTransforms).d.d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (pTVar1->graphicsTransforms).d.ptr;
    (__return_storage_ptr__->d).size = (pTVar1->graphicsTransforms).d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGraphicsTransform **)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsTransform *> QGraphicsItem::transformations() const
{
    if (!d_ptr->transformData)
        return QList<QGraphicsTransform *>();
    return d_ptr->transformData->graphicsTransforms;
}